

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  ostream *poVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  size_type sVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  string infile;
  string s;
  Validator validator;
  ifstream ifs;
  char buffer [32768];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8298;
  ulong local_8278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8270;
  Validator local_8250;
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  undefined1 local_8038 [32];
  undefined4 local_8018;
  undefined8 local_8014;
  uint32_t local_800c;
  
  if (argc < 2) {
    local_8278 = 0;
    pcVar12 = (char *)0x0;
  }
  else {
    bVar13 = true;
    uVar9 = 1;
    pcVar12 = (char *)0x0;
    local_8278 = 0;
    do {
      pcVar8 = argv[uVar9];
      if (bVar13) {
        iVar4 = strcmp(pcVar8,"--help");
        if (iVar4 == 0) {
          usage(argv);
          return 0;
        }
        iVar4 = strcmp(pcVar8,"--hex");
        if (iVar4 == 0) {
          local_8278 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
          bVar13 = true;
        }
        else {
          if (((*pcVar8 != '-') || (pcVar8[1] != '-')) || (pcVar8[2] != '\0')) goto LAB_00102c28;
          bVar13 = false;
        }
      }
      else {
LAB_00102c28:
        bVar14 = pcVar12 != (char *)0x0;
        pcVar12 = pcVar8;
        if (bVar14) {
          usage(argv);
          return 1;
        }
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
  }
  pcVar8 = "-";
  if (pcVar12 != (char *)0x0) {
    pcVar8 = pcVar12;
  }
  local_8298._M_dataplus._M_p = (pointer)&local_8298.field_2;
  sVar5 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8298,pcVar8,pcVar8 + sVar5);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_8298,"-");
  if (iVar4 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_8298,0,local_8298._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_8270._M_string_length = 0;
  local_8270.field_2._M_local_buf[0] = '\0';
  local_8270._M_dataplus._M_p = (pointer)&local_8270.field_2;
  std::ifstream::ifstream(&local_8240,(string *)&local_8298,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_8298._M_dataplus._M_p,
                        local_8298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    iVar4 = 1;
    std::ostream::flush();
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_8270,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
      std::istream::read((char *)&local_8240,(long)local_8038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_8270,local_8038,local_8238);
    }
    std::ifstream::close();
    if ((local_8278 & 1) != 0) {
      local_8038._8_8_ = (AttributeTranslator *)0x0;
      local_8038[0x10] = '\0';
      local_8038._0_8_ = local_8038 + 0x10;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038,
                 local_8270._M_string_length);
      sVar2 = local_8270._M_string_length;
      if (local_8270._M_string_length != 0) {
        sVar10 = 0;
        iVar4 = -1;
        do {
          bVar1 = local_8270._M_dataplus._M_p[sVar10];
          iVar7 = -1;
          if ((char)bVar1 < 0x30) goto LAB_00102fa4;
          iVar11 = -0x30;
          if (bVar1 < 0x3a) {
LAB_00102f65:
            iVar7 = iVar11 + (char)bVar1;
            if (iVar4 != -1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_8038,(char)iVar7 + (char)(iVar4 << 4));
              iVar7 = -1;
            }
          }
          else if (bVar1 < 0x61) {
            iVar11 = -0x37;
            if ((byte)(bVar1 + 0xbf) < 6) goto LAB_00102f65;
          }
          else {
            iVar11 = -0x57;
            if (bVar1 < 0x67) goto LAB_00102f65;
          }
LAB_00102fa4:
          sVar10 = sVar10 + 1;
          iVar4 = iVar7;
        } while (sVar2 != sVar10);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_8270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038);
      if ((undefined1 *)local_8038._0_8_ != local_8038 + 0x10) {
        operator_delete((void *)local_8038._0_8_,
                        CONCAT35(local_8038._21_3_,CONCAT41(local_8038._17_4_,local_8038[0x10])) + 1
                       );
      }
    }
    local_8038._0_8_ = (pointer)0x200000002;
    local_8038._8_8_ = (AttributeTranslator *)0x0;
    local_8038[0x10] = '\0';
    local_8038._17_4_ = 0;
    local_8038._21_3_ = 0;
    local_8038[0x18] = false;
    local_8038[0x19] = false;
    local_8038[0x1a] = false;
    local_8038[0x1b] = false;
    local_8038[0x1c] = false;
    local_8038[0x1d] = true;
    local_8018._0_1_ = false;
    local_8018._1_1_ = true;
    local_8018._2_1_ = false;
    local_8018._3_1_ = true;
    local_8014._0_1_ = false;
    local_8014._1_1_ = false;
    local_8014._2_1_ = false;
    local_8014._3_1_ = false;
    local_8014._4_1_ = false;
    local_8014._5_1_ = false;
    local_8014._6_1_ = false;
    local_8014._7_1_ = false;
    local_800c = 0xffffffff;
    local_8038[0x1e] = true;
    local_8038[0x1f] = true;
    arangodb::velocypack::Validator::Validator(&local_8250,(Options *)local_8038);
    arangodb::velocypack::Validator::validate
              (&local_8250,(uint8_t *)local_8270._M_dataplus._M_p,local_8270._M_string_length,false)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The velocypack in infile \'",0x1a);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_8298._M_dataplus._M_p,
                        local_8298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' is valid",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar4 = 0;
  }
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8270._M_dataplus._M_p != &local_8270.field_2) {
    operator_delete(local_8270._M_dataplus._M_p,
                    CONCAT71(local_8270.field_2._M_allocated_capacity._1_7_,
                             local_8270.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8298._M_dataplus._M_p != &local_8298.field_2) {
    operator_delete(local_8298._M_dataplus._M_p,local_8298.field_2._M_allocated_capacity + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  bool allowFlags = true;
  bool hex = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;

  try {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
    std::cout << "The velocypack in infile '" << infile << "' is valid"
              << std::endl;
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}